

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O1

void __thiscall cmExportSet::~cmExportSet(cmExportSet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer pcVar4;
  pointer ppcVar5;
  DefaultDeleter<std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>,_false> local_21;
  
  ppcVar5 = (this->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (this->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar5 != ppcVar2) {
    do {
      ContainerAlgorithms::
      DefaultDeleter<std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>,_false>::
      operator()(&local_21,*ppcVar5);
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != ppcVar2);
  }
  ppcVar3 = (this->Installations).
            super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar3 != (pointer)0x0) {
    operator_delete(ppcVar3,(long)(this->Installations).
                                  super__Vector_base<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar3
                   );
  }
  pcVar4 = (this->Name)._M_dataplus._M_p;
  paVar1 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  ppcVar5 = (this->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar5 != (pointer)0x0) {
    operator_delete(ppcVar5,(long)(this->TargetExports).
                                  super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar5
                   );
  }
  return;
}

Assistant:

cmExportSet::~cmExportSet()
{
  cmDeleteAll(this->TargetExports);
}